

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

int jmp_novalue(FuncState *fs,BCPos list)

{
  uint uVar1;
  BCPos in_ESI;
  FuncState *in_RDI;
  BCIns p;
  uint local_24;
  BCPos local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (local_14 == 0xffffffff) {
      return 0;
    }
    if (local_14 == 0) {
      local_24 = local_14;
    }
    else {
      local_24 = local_14 - 1;
    }
    uVar1 = in_RDI->bcbase[local_24].ins;
    if ((((uVar1 & 0xff) != 0xc) && ((uVar1 & 0xff) != 0xd)) && ((uVar1 >> 8 & 0xff) != 0xff))
    break;
    local_14 = jmp_next(in_RDI,local_14);
  }
  return 1;
}

Assistant:

static int jmp_novalue(FuncState *fs, BCPos list)
{
  for (; list != NO_JMP; list = jmp_next(fs, list)) {
    BCIns p = fs->bcbase[list >= 1 ? list-1 : list].ins;
    if (!(bc_op(p) == BC_ISTC || bc_op(p) == BC_ISFC || bc_a(p) == NO_REG))
      return 1;
  }
  return 0;
}